

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_reader.cpp
# Opt level: O2

void __thiscall
HttpdBufferedReader_SomeCharactersThenAnError_Test::
~HttpdBufferedReader_SomeCharactersThenAnError_Test
          (HttpdBufferedReader_SomeCharactersThenAnError_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (HttpdBufferedReader, SomeCharactersThenAnError) {
    refiller r;
    EXPECT_CALL (r, fill (0, _)).WillOnce (Invoke (yield_string ("abc\nd")));
    EXPECT_CALL (r, fill (1, _)).WillOnce (Invoke ([] (int, span<std::uint8_t> const &) {
        return refiller_result_type (std::make_error_code (std::errc::operation_not_permitted));
    }));

    auto io = 0;
    auto br = make_buffered_reader<int> (r.refill_function ());
    {
        gets_result_type const s1 = br.gets (io);
        ASSERT_TRUE (static_cast<bool> (s1)) << "Error: " << s1.get_error ();
        maybe<std::string> str1;
        std::tie (io, str1) = *s1;
        ASSERT_TRUE (str1.has_value ());
        EXPECT_EQ (str1.value (), "abc");
    }
    {
        gets_result_type const s2 = br.gets (io);
        ASSERT_FALSE (static_cast<bool> (s2)) << "An error was expected";
        EXPECT_EQ (s2.get_error (), (std::make_error_code (std::errc::operation_not_permitted)));
    }
}